

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_env_cell_loc1(sexp env,sexp key,int localp,sexp_conflict *varenv)

{
  bool bVar1;
  sexp ls;
  sexp_conflict *varenv_local;
  int localp_local;
  sexp key_local;
  sexp env_local;
  
  env_local = env;
  do {
    ls = (env_local->value).type.getters;
    while( true ) {
      bVar1 = false;
      if (((ulong)ls & 3) == 0) {
        bVar1 = ls->tag == 6;
      }
      if (!bVar1) break;
      if ((ls->value).type.name == key) {
        if (varenv != (sexp_conflict *)0x0) {
          *varenv = env_local;
        }
        return (ls->value).type.cpl;
      }
      ls = (ls->value).type.slots;
    }
    ls = (env_local->value).type.slots;
    while( true ) {
      bVar1 = false;
      if (((ulong)ls & 3) == 0) {
        bVar1 = ls->tag == 6;
      }
      if (!bVar1) break;
      if ((ls->value).type.name == key) {
        if (varenv != (sexp_conflict *)0x0) {
          *varenv = env_local;
        }
        return ls;
      }
      ls = (ls->value).type.slots;
    }
    if (localp != 0) {
      return (sexp)0x0;
    }
    env_local = (env_local->value).type.name;
    bVar1 = false;
    if ((env_local != (sexp)0x0) && (bVar1 = false, ((ulong)env_local & 3) == 0)) {
      bVar1 = env_local->tag == 0x17;
    }
  } while (bVar1);
  return (sexp)0x0;
}

Assistant:

static sexp sexp_env_cell_loc1 (sexp env, sexp key, int localp, sexp *varenv) {
  sexp ls;
  do {
#if SEXP_USE_RENAME_BINDINGS
    for (ls=sexp_env_renames(env); sexp_pairp(ls); ls=sexp_env_next_cell(ls))
      if (sexp_car(ls) == key) {
        if (varenv) *varenv = env;
        return sexp_cdr(ls);
      }
#endif
    for (ls=sexp_env_bindings(env); sexp_pairp(ls); ls=sexp_env_next_cell(ls))
      if (sexp_car(ls) == key) {
        if (varenv) *varenv = env;
        return ls;
      }
    if (localp) break;
    env = sexp_env_parent(env);
  } while (env && sexp_envp(env));
  return NULL;
}